

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::MergeFrom(MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            *this,MapFieldLite<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                  *other)

{
  Value *from;
  value_type *key;
  Value *this_00;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  local_58;
  undefined1 local_40 [8];
  const_iterator it;
  
  local_58.m_ = (other->map_).elements_;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  ::InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::SearchFrom(&local_58,(local_58.m_)->index_of_first_non_null_);
  local_40 = (undefined1  [8])local_58.node_;
  it.it_.node_ = (Node *)local_58.m_;
  it.it_.m_ = (InnerMap *)local_58.bucket_index_;
  if (local_58.node_ != (Node *)0x0) {
    do {
      key = ((KeyValuePair *)local_40)->v_;
      from = &key->second;
      this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                ::operator[](&this->map_,&key->first);
      if (from != this_00) {
        Value::Clear(this_00);
        Value::MergeFrom(this_00,from);
      }
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
      ::InnerMap::
      iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
      ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
                    *)local_40);
    } while (local_40 != (undefined1  [8])0x0);
  }
  return;
}

Assistant:

void MergeFrom(const MapFieldLite& other) {
    for (typename Map<Key, T>::const_iterator it = other.map_.begin();
         it != other.map_.end(); ++it) {
      map_[it->first] = it->second;
    }
  }